

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void scandir_cb(uv_fs_t *req)

{
  int iVar1;
  uv_dirent_t dent_00;
  undefined1 local_20 [8];
  uv_dirent_t dent;
  uv_fs_t *req_local;
  
  dent._8_8_ = req;
  if (req != &scandir_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x265,"req == &scandir_req");
    abort();
  }
  if (scandir_req.fs_type != UV_FS_SCANDIR) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x266,"req->fs_type == UV_FS_SCANDIR");
    abort();
  }
  if (scandir_req.result != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x267,"req->result == 2");
    abort();
  }
  if (scandir_req.ptr == (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x268,"req->ptr");
    abort();
  }
  dent._8_8_ = &scandir_req;
  while( true ) {
    iVar1 = uv_fs_scandir_next((uv_fs_t *)dent._8_8_,(uv_dirent_t *)local_20);
    if (iVar1 == -0xfff) break;
    iVar1 = strcmp((char *)local_20,"file1");
    if (iVar1 != 0) {
      iVar1 = strcmp((char *)local_20,"file2");
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
                ,0x26b,"strcmp(dent.name, \"file1\") == 0 || strcmp(dent.name, \"file2\") == 0");
        abort();
      }
    }
    dent_00.type = dent.name._0_4_;
    dent_00.name = (char *)local_20;
    dent_00._12_4_ = 0;
    assert_is_file_type(dent_00);
  }
  scandir_cb_count = scandir_cb_count + 1;
  if (*(long *)(dent._8_8_ + 0x68) == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x26f,"req->path");
    abort();
  }
  iVar1 = memcmp(*(void **)(dent._8_8_ + 0x68),"test_dir",9);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x270,"memcmp(req->path, \"test_dir\\0\", 9) == 0");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)dent._8_8_);
  if (*(long *)(dent._8_8_ + 0x60) != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x272,"!req->ptr");
    abort();
  }
  return;
}

Assistant:

static void scandir_cb(uv_fs_t* req) {
  uv_dirent_t dent;
  ASSERT(req == &scandir_req);
  ASSERT(req->fs_type == UV_FS_SCANDIR);
  ASSERT(req->result == 2);
  ASSERT(req->ptr);

  while (UV_EOF != uv_fs_scandir_next(req, &dent)) {
    ASSERT(strcmp(dent.name, "file1") == 0 || strcmp(dent.name, "file2") == 0);
    assert_is_file_type(dent);
  }
  scandir_cb_count++;
  ASSERT(req->path);
  ASSERT(memcmp(req->path, "test_dir\0", 9) == 0);
  uv_fs_req_cleanup(req);
  ASSERT(!req->ptr);
}